

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int mbedtls_ecjpake_read_round_two(mbedtls_ecjpake_context *ctx,uchar *buf,size_t len)

{
  undefined1 local_128 [8];
  mbedtls_ecp_point G;
  mbedtls_ecp_group grp;
  uchar *end;
  uchar *p;
  size_t sStack_20;
  int ret;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ecjpake_context *ctx_local;
  
  p._4_4_ = 0xffffff92;
  end = buf;
  sStack_20 = len;
  len_local = (size_t)buf;
  buf_local = (uchar *)ctx;
  mbedtls_ecp_group_init((mbedtls_ecp_group *)&G.Z.s);
  mbedtls_ecp_point_init((mbedtls_ecp_point *)local_128);
  p._4_4_ = ecjpake_ecp_add3((mbedtls_ecp_group *)(buf_local + 8),(mbedtls_ecp_point *)local_128,
                             (mbedtls_ecp_point *)(buf_local + 0xd0),
                             (mbedtls_ecp_point *)(buf_local + 0x100),
                             (mbedtls_ecp_point *)(buf_local + 0x130));
  if (p._4_4_ != 0) goto LAB_002993fe;
  if (*(int *)(buf_local + 200) == 0) {
    p._4_4_ = mbedtls_ecp_tls_read_group((mbedtls_ecp_group *)&G.Z.s,&end,sStack_20);
    if (p._4_4_ != 0) goto LAB_002993fe;
    if (G.Z._8_4_ != *(int *)(buf_local + 8)) {
      p._4_4_ = -0x4e80;
      goto LAB_002993fe;
    }
  }
  p._4_4_ = 0;
  p._4_4_ = ecjpake_kkp_read(*(mbedtls_md_type_t *)buf_local,(mbedtls_ecp_group *)(buf_local + 8),
                             *(int *)(buf_local + 0xcc),(mbedtls_ecp_point *)local_128,
                             (mbedtls_ecp_point *)(buf_local + 400),
                             ecjpake_id[1 - *(int *)(buf_local + 200)],&end,buf + len);
  if ((p._4_4_ == 0) && (end != buf + len)) {
    p._4_4_ = -0x4f80;
  }
LAB_002993fe:
  mbedtls_ecp_group_free((mbedtls_ecp_group *)&G.Z.s);
  mbedtls_ecp_point_free((mbedtls_ecp_point *)local_128);
  return p._4_4_;
}

Assistant:

int mbedtls_ecjpake_read_round_two(mbedtls_ecjpake_context *ctx,
                                   const unsigned char *buf,
                                   size_t len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const unsigned char *p = buf;
    const unsigned char *end = buf + len;
    mbedtls_ecp_group grp;
    mbedtls_ecp_point G;    /* C: GB, S: GA */

    mbedtls_ecp_group_init(&grp);
    mbedtls_ecp_point_init(&G);

    /*
     * Server: GA = X3  + X4  + X1      (7.4.2.6.1)
     * Client: GB = X1  + X2  + X3      (7.4.2.5.1)
     * Unified: G = Xm1 + Xm2 + Xp1
     * We need that before parsing in order to check Xp as we read it
     */
    MBEDTLS_MPI_CHK(ecjpake_ecp_add3(&ctx->grp, &G,
                                     &ctx->Xm1, &ctx->Xm2, &ctx->Xp1));

    /*
     * struct {
     *     ECParameters curve_params;   // only client reading server msg
     *     ECJPAKEKeyKP ecjpake_key_kp;
     * } Client/ServerECJPAKEParams;
     */
    if (ctx->role == MBEDTLS_ECJPAKE_CLIENT) {
        MBEDTLS_MPI_CHK(mbedtls_ecp_tls_read_group(&grp, &p, len));
        if (grp.id != ctx->grp.id) {
            ret = MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
            goto cleanup;
        }
    }

    MBEDTLS_MPI_CHK(ecjpake_kkp_read(ctx->md_type, &ctx->grp,
                                     ctx->point_format,
                                     &G, &ctx->Xp, ID_PEER, &p, end));

    if (p != end) {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

cleanup:
    mbedtls_ecp_group_free(&grp);
    mbedtls_ecp_point_free(&G);

    return ret;
}